

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Vec3fa embree::cartesian(float phi,float cosTheta)

{
  undefined8 in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  float local_5c;
  float in_stack_ffffffffffffffb8;
  undefined1 local_40 [16];
  undefined1 *local_30;
  undefined1 *local_28;
  float local_1c;
  float local_18;
  undefined4 local_14;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_30 = local_40;
  local_10 = &zero;
  local_8 = &one;
  local_18 = -in_XMM1_Da * in_XMM1_Da + 1.0;
  local_14 = 0;
  local_5c = local_18;
  if (local_18 <= 0.0) {
    local_5c = 0.0;
  }
  local_1c = local_5c;
  local_28 = local_30;
  sqrtf(local_5c);
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
          cartesian(in_XMM0_Da,in_stack_ffffffffffffffb8,(float)((ulong)in_RDI >> 0x20));
  return (Vec3fa)aVar1;
}

Assistant:

inline Vec3fa cartesian(const float phi, const float cosTheta)
{
  return cartesian(phi, cos2sin(cosTheta), cosTheta);
}